

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall Array::getData(Array *this,int x,int y,int *res)

{
  int *res_local;
  int y_local;
  int x_local;
  Array *this_local;
  
  if ((((x < 0) || (this->_width <= x)) || (y < 0)) || (this->_height <= y)) {
    this_local._7_1_ = false;
  }
  else {
    *res = this->_data[y][x];
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Array::getData(int x, int y, int& res)
{
	if (x < 0 || x >= _width
		|| y < 0 || y >= _height)
		return false;

	res = _data[y][x];

	return true;
}